

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

string * fmt::v8::vformat_abi_cxx11_(string_view fmt,format_args args)

{
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  basic_string_view<char> fmt_00;
  unsigned_long_long in_RCX;
  size_t in_RDX;
  char *in_RSI;
  string *in_RDI;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R8;
  memory_buffer buffer;
  locale_ref local_280;
  unsigned_long_long local_278;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  aStackY_270;
  char *local_268;
  size_t sStackY_260;
  allocator<char> local_241 [17];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)(local_241 + 1),local_241);
  std::allocator<char>::~allocator(local_241);
  local_278 = in_RCX;
  aStackY_270 = in_R8;
  local_268 = in_RSI;
  sStackY_260 = in_RDX;
  detail::locale_ref::locale_ref(&local_280);
  fmt_00.size_ = sStackY_260;
  fmt_00.data_ = local_268;
  args_00.field_1.args_ = aStackY_270.args_;
  args_00.desc_ = local_278;
  detail::vformat_to<char>((buffer<char> *)(local_241 + 1),fmt_00,args_00,local_280);
  to_string<char,500ul>(in_stack_fffffffffffffdd0);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)(local_241 + 1));
  return in_RDI;
}

Assistant:

FMT_FUNC std::string vformat(string_view fmt, format_args args) {
  // Don't optimize the "{}" case to keep the binary size small and because it
  // can be better optimized in fmt::format anyway.
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  return to_string(buffer);
}